

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

VerifyDBResult __thiscall
CVerifyDB::VerifyDB(CVerifyDB *this,Chainstate *chainstate,Params *consensus_params,
                   CCoinsView *coinsview,int nCheckLevel,int nCheckDepth)

{
  int *args;
  long lVar1;
  pointer ppCVar2;
  Notifications *pNVar3;
  bool bVar4;
  bool bVar5;
  DisconnectResult DVar6;
  ulong uVar7;
  FlatFilePos FVar8;
  size_t sVar9;
  CCoinsViewCache *this_00;
  size_t sVar10;
  CBlockIndex *pCVar11;
  int iVar12;
  CBlockIndex *pCVar13;
  VerifyDBResult VVar14;
  VerifyDBResult VVar15;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view logging_function_11;
  string_view logging_function_12;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view source_file_11;
  string_view source_file_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  byte bVar17;
  int *in_stack_fffffffffffffca0;
  int *args_1;
  ulong local_358;
  CBlockIndex *local_350;
  int percentageDone_1;
  int block_count;
  int local_324;
  int nCheckDepth_local;
  int local_31c;
  CBlockUndo undo;
  base_blob<256U> local_2f8;
  string local_2d8;
  CBlock block;
  BlockValidationState state;
  CCoinsViewCache coins;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar2 = (chainstate->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar7 = (long)ppCVar2 -
          (long)(chainstate->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  VVar15 = SUCCESS;
  nCheckDepth_local = nCheckDepth;
  if (((uVar7 != 0) && (pCVar11 = ppCVar2[-1], pCVar11 != (CBlockIndex *)0x0)) &&
     (VVar15 = SUCCESS, pCVar11->pprev != (CBlockIndex *)0x0)) {
    iVar12 = (int)(uVar7 >> 3);
    if ((nCheckDepth < 1) || (iVar12 <= nCheckDepth)) {
      nCheckDepth_local = iVar12 + -1;
    }
    local_31c = nCheckLevel;
    if (nCheckLevel < 1) {
      local_31c = 0;
    }
    if (3 < local_31c) {
      local_31c = 4;
    }
    logging_function._M_str = "VerifyDB";
    logging_function._M_len = 8;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    LogPrintf_<int,int>(logging_function,source_file,0x1269,
                        I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|CMPCTBLOCK|ADDRMAN|ESTIMATEFEE|RPC
                        |WALLETDB|BENCH|HTTP|MEMPOOL,(Level)&nCheckDepth_local,(char *)&local_31c,
                        (int *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
                        in_stack_fffffffffffffca0);
    CCoinsViewCache::CCoinsViewCache(&coins,coinsview,false);
    local_324 = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
         '\0';
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    logging_function_00._M_str = "VerifyDB";
    logging_function_00._M_len = 8;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file_00._M_len = 0x57;
    ::LogPrintf_<>(logging_function_00,source_file_00,0x1272,ALL,Info,"Verification progress: 0%%\n"
                  );
    ppCVar2 = (chainstate->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_358 = 0;
    if (ppCVar2 ==
        (chainstate->m_chain).vChain.
        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pCVar11 = (CBlockIndex *)0x0;
    }
    else {
      pCVar11 = ppCVar2[-1];
    }
    bVar17 = (chainstate->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
             _M_payload.super__Optional_payload_base<uint256>._M_engaged;
    VVar15 = INTERRUPTED;
    args_1 = (int *)0x0;
    local_350 = (CBlockIndex *)0x0;
    while( true ) {
      VVar14 = SUCCESS;
      if ((pCVar11 == (CBlockIndex *)0x0) || (pCVar11->pprev == (CBlockIndex *)0x0))
      goto LAB_0036f21b;
      iVar12 = 0x32;
      if (local_31c < 4) {
        iVar12 = 100;
      }
      block_count = (int)((double)iVar12 *
                         ((double)(~pCVar11->nHeight +
                                  (int)((ulong)((long)(chainstate->m_chain).vChain.
                                                                                                            
                                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(chainstate->m_chain).vChain.
                                                                                                          
                                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3))
                         / (double)nCheckDepth_local));
      if (0x62 < block_count) {
        block_count = 99;
      }
      if (block_count < 2) {
        block_count = 1;
      }
      if ((int)local_358 < (int)(uint)(byte)(((ushort)block_count & 0xff) / 10)) {
        logging_function_01._M_str = "VerifyDB";
        logging_function_01._M_len = 8;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_01._M_len = 0x57;
        LogPrintf_<int>(logging_function_01,source_file_01,0x127a,ALL,Info,
                        "Verification progress: %d%%\n",&block_count);
        local_358 = (long)block_count / 10 & 0xffffffff;
      }
      pNVar3 = this->m_notifications;
      _((bilingual_str *)&block,(ConstevalStringLiteral)0x699758);
      (*pNVar3->_vptr_Notifications[4])(pNVar3,&block,(ulong)(uint)block_count,0);
      args = &pCVar11->nHeight;
      bilingual_str::~bilingual_str((bilingual_str *)&block);
      if (*args <= ~nCheckDepth_local +
                   (int)((ulong)((long)(chainstate->m_chain).vChain.
                                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(chainstate->m_chain).vChain.
                                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3)) break;
      if (((chainstate->m_blockman->m_prune_mode | bVar17) == 1) && ((pCVar11->nStatus & 8) == 0)) {
        logging_function_04._M_str = "VerifyDB";
        logging_function_04._M_len = 8;
        source_file_04._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_04._M_len = 0x57;
        LogPrintf_<int>(logging_function_04,source_file_04,0x1284,ALL,Info,
                        "VerifyDB(): block verification stopping at height %d (no data). This could be due to pruning or use of an assumeutxo snapshot.\n"
                        ,args);
        VVar14 = SKIPPED_MISSING_BLOCKS;
        goto LAB_0036f21b;
      }
      CBlock::CBlock(&block);
      bVar4 = ::node::BlockManager::ReadBlockFromDisk(chainstate->m_blockman,&block,pCVar11);
      if (!bVar4) {
        CBlockIndex::GetBlockHash((uint256 *)&local_2f8,pCVar11);
        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36f110;
        base_blob<256u>::ToString_abi_cxx11_(&local_2d8,(base_blob<256u> *)&local_2f8);
        logging_function_02._M_str = "VerifyDB";
        logging_function_02._M_len = 8;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_02._M_len = 0x57;
        LogPrintf_<int,std::__cxx11::string>
                  (logging_function_02,source_file_02,0x128b,TOR,0x6d94bb,(char *)args,
                   (int *)&local_2d8,pbVar16);
LAB_0036f1bd:
        std::__cxx11::string::~string((string *)&local_2d8);
LAB_0036f1ca:
        VVar15 = CORRUPTED_BLOCK_DB;
LAB_0036f1ce:
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector(&block.vtx);
        goto LAB_0036f595;
      }
      if (local_31c < 1) goto LAB_0036efdf;
      bVar4 = CheckBlock(&block,&state,consensus_params,true,true);
      if (!bVar4) {
        CBlockIndex::GetBlockHash((uint256 *)&local_2f8,pCVar11);
        base_blob<256u>::ToString_abi_cxx11_(&local_2d8,(base_blob<256u> *)&local_2f8);
        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36f180;
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  ((string *)&undo,&state.super_ValidationState<BlockValidationResult>);
        logging_function_03._M_str = "VerifyDB";
        logging_function_03._M_len = 8;
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_03._M_len = 0x57;
        LogPrintf_<int,std::__cxx11::string,std::__cxx11::string>
                  (logging_function_03,source_file_03,0x1291,
                   I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|CMPCTBLOCK|SELECTCOINS|RPC|WALLETDB|ZMQ
                   |BENCH|HTTP,(Level)args,(char *)&local_2d8,(int *)&undo,pbVar16,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar17,in_stack_fffffffffffffc98));
        std::__cxx11::string::~string((string *)&undo);
        goto LAB_0036f1bd;
      }
      if (1 < local_31c) {
        undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        FVar8 = CBlockIndex::GetUndoPos(pCVar11);
        if ((FVar8.nFile == -1) ||
           (bVar4 = ::node::BlockManager::UndoReadFromDisk(chainstate->m_blockman,&undo,pCVar11),
           bVar4)) {
          std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&undo.vtxundo);
          goto LAB_0036efdf;
        }
        CBlockIndex::GetBlockHash((uint256 *)&local_2f8,pCVar11);
        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36f5fe;
        base_blob<256u>::ToString_abi_cxx11_(&local_2d8,(base_blob<256u> *)&local_2f8);
        logging_function_11._M_str = "VerifyDB";
        logging_function_11._M_len = 8;
        source_file_11._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_11._M_len = 0x57;
        LogPrintf_<int,std::__cxx11::string>
                  (logging_function_11,source_file_11,0x1299,TOR,0x6d9531,(char *)args,
                   (int *)&local_2d8,pbVar16);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&undo.vtxundo);
        goto LAB_0036f1ca;
      }
LAB_0036efdf:
      sVar9 = CCoinsViewCache::DynamicMemoryUsage(&coins);
      this_00 = Chainstate::CoinsTip(chainstate);
      sVar10 = CCoinsViewCache::DynamicMemoryUsage(this_00);
      pCVar13 = local_350;
      iVar12 = local_324;
      if (2 < local_31c) {
        if (chainstate->m_coinstip_cache_size_bytes < sVar10 + sVar9) {
          args_1 = (int *)CONCAT71((int7)(sVar10 + sVar9 >> 8),1);
        }
        else {
          CCoinsViewCache::GetBestBlock((uint256 *)&local_2d8,&coins);
          CBlockIndex::GetBlockHash((uint256 *)&local_2f8,pCVar11);
          bVar4 = ::operator==((base_blob<256U> *)&local_2d8,&local_2f8);
          if (!bVar4) {
            __assert_fail("coins.GetBestBlock() == pindex->GetBlockHash()",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x12a3,
                          "VerifyDBResult CVerifyDB::VerifyDB(Chainstate &, const Consensus::Params &, CCoinsView &, int, int)"
                         );
          }
          DVar6 = Chainstate::DisconnectBlock(chainstate,&block,pCVar11,&coins);
          pCVar13 = pCVar11;
          iVar12 = 0;
          if (DVar6 != DISCONNECT_UNCLEAN) {
            if (DVar6 == DISCONNECT_FAILED) {
              CBlockIndex::GetBlockHash((uint256 *)&local_2f8,pCVar11);
              pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x36f673;
              base_blob<256u>::ToString_abi_cxx11_(&local_2d8,(base_blob<256u> *)&local_2f8);
              logging_function_12._M_str = "VerifyDB";
              logging_function_12._M_len = 8;
              source_file_12._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
              ;
              source_file_12._M_len = 0x57;
              LogPrintf_<int,std::__cxx11::string>
                        (logging_function_12,source_file_12,0x12a6,TOR,0x6d95fc,(char *)args,
                         (int *)&local_2d8,pbVar16);
              goto LAB_0036f1bd;
            }
            pCVar13 = local_350;
            iVar12 = (int)((ulong)((long)block.vtx.
                                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)block.vtx.
                                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) + local_324
            ;
          }
        }
      }
      local_324 = iVar12;
      local_350 = pCVar13;
      bVar4 = util::SignalInterrupt::operator_cast_to_bool(chainstate->m_chainman->m_interrupt);
      if (bVar4) goto LAB_0036f1ce;
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&block.vtx);
      pCVar11 = pCVar11->pprev;
    }
    VVar14 = SUCCESS;
LAB_0036f21b:
    if (local_350 == (CBlockIndex *)0x0) {
      if (((ulong)args_1 & 1) != 0) {
        logging_function_06._M_str = "VerifyDB";
        logging_function_06._M_len = 8;
        source_file_06._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_06._M_len = 0x57;
        ::LogPrintf_<>(logging_function_06,source_file_06,0x12ba,ALL,Info,
                       "Skipped verification of level >=3 (insufficient database cache size). Consider increasing -dbcache.\n"
                      );
      }
      block_count = ~pCVar11->nHeight +
                    (int)((ulong)((long)(chainstate->m_chain).vChain.
                                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(chainstate->m_chain).vChain.
                                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (local_31c < 4 || ((ulong)args_1 & 1) != 0) {
LAB_0036f2d9:
        logging_function_07._M_str = "VerifyDB";
        logging_function_07._M_len = 8;
        source_file_07._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_07._M_len = 0x57;
        LogPrintf_<int,int>(logging_function_07,source_file_07,0x12d8,
                            I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|CMPCTBLOCK|SELECTCOINS|ADDRMAN
                            |ESTIMATEFEE|WALLETDB|BENCH|HTTP|MEMPOOL|TOR,(Level)&block_count,
                            (char *)&local_324,(int *)CONCAT17(bVar17,in_stack_fffffffffffffc98),
                            args_1);
        VVar15 = VVar14;
        if (((ulong)args_1 & 1) != 0) {
          VVar15 = SKIPPED_L3_CHECKS;
        }
      }
      else {
        VVar15 = CORRUPTED_BLOCK_DB;
        do {
          ppCVar2 = (chainstate->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          uVar7 = (long)ppCVar2 -
                  (long)(chainstate->m_chain).vChain.
                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
          if (uVar7 == 0) {
            pCVar13 = (CBlockIndex *)0x0;
          }
          else {
            pCVar13 = ppCVar2[-1];
          }
          if (pCVar11 == pCVar13) goto LAB_0036f2d9;
          iVar12 = (int)(((double)(~pCVar11->nHeight + (int)(uVar7 >> 3)) /
                         (double)nCheckDepth_local) * 50.0);
          percentageDone_1 = 100 - iVar12;
          if (percentageDone_1 < 2) {
            percentageDone_1 = 1;
          }
          if (iVar12 < 2) {
            percentageDone_1 = 99;
          }
          if ((int)local_358 < (int)((uint)percentageDone_1 / 10)) {
            logging_function_08._M_str = "VerifyDB";
            logging_function_08._M_len = 8;
            source_file_08._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
            ;
            source_file_08._M_len = 0x57;
            LogPrintf_<int>(logging_function_08,source_file_08,0x12c6,ALL,Info,
                            "Verification progress: %d%%\n",&percentageDone_1);
            local_358 = (long)percentageDone_1 / 10 & 0xffffffff;
          }
          pNVar3 = this->m_notifications;
          _((bilingual_str *)&block,(ConstevalStringLiteral)0x699758);
          (*pNVar3->_vptr_Notifications[4])(pNVar3,&block,(ulong)(uint)percentageDone_1,0);
          bilingual_str::~bilingual_str((bilingual_str *)&block);
          pCVar11 = CChain::Next(&chainstate->m_chain,pCVar11);
          CBlock::CBlock(&block);
          bVar4 = ::node::BlockManager::ReadBlockFromDisk(chainstate->m_blockman,&block,pCVar11);
          if (bVar4) {
            bVar4 = Chainstate::ConnectBlock(chainstate,&block,&state,pCVar11,&coins,false);
            if (!bVar4) {
              CBlockIndex::GetBlockHash((uint256 *)&local_2f8,pCVar11);
              base_blob<256u>::ToString_abi_cxx11_(&local_2d8,(base_blob<256u> *)&local_2f8);
              pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x36f526;
              ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                        ((string *)&undo,&state.super_ValidationState<BlockValidationResult>);
              logging_function_10._M_str = "VerifyDB";
              logging_function_10._M_len = 8;
              source_file_10._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
              ;
              source_file_10._M_len = 0x57;
              LogPrintf_<int,std::__cxx11::string,std::__cxx11::string>
                        (logging_function_10,source_file_10,0x12d1,
                         I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|CMPCTBLOCK|SELECTCOINS|ADDRMAN|
                         ESTIMATEFEE|BENCH|HTTP|TOR|NET,(int)pCVar11 + 0x18,(char *)&local_2d8,
                         (int *)&undo,pbVar16,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(bVar17,in_stack_fffffffffffffc98));
              std::__cxx11::string::~string((string *)&undo);
              goto LAB_0036f573;
            }
            bVar5 = util::SignalInterrupt::operator_cast_to_bool
                              (chainstate->m_chainman->m_interrupt);
            bVar4 = !bVar5;
            if (bVar5) {
              VVar15 = INTERRUPTED;
            }
          }
          else {
            CBlockIndex::GetBlockHash((uint256 *)&local_2f8,pCVar11);
            pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36f4ac;
            base_blob<256u>::ToString_abi_cxx11_(&local_2d8,(base_blob<256u> *)&local_2f8);
            logging_function_09._M_str = "VerifyDB";
            logging_function_09._M_len = 8;
            source_file_09._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
            ;
            source_file_09._M_len = 0x57;
            LogPrintf_<int,std::__cxx11::string>
                      (logging_function_09,source_file_09,0x12cd,TOR,0x6d94bb,
                       (char *)&pCVar11->nHeight,(int *)&local_2d8,pbVar16);
LAB_0036f573:
            std::__cxx11::string::~string((string *)&local_2d8);
            bVar4 = false;
            VVar15 = CORRUPTED_BLOCK_DB;
          }
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector(&block.vtx);
        } while (bVar4);
      }
    }
    else {
      block.super_CBlockHeader.nVersion =
           (int)((ulong)((long)(chainstate->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(chainstate->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) - local_350->nHeight;
      logging_function_05._M_str = "VerifyDB";
      logging_function_05._M_len = 8;
      source_file_05._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_05._M_len = 0x57;
      LogPrintf_<int,int>(logging_function_05,source_file_05,0x12b6,
                          I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|CMPCTBLOCK|SELECTCOINS|ADDRMAN|
                          WALLETDB|HTTP|TOR,(Level)&block,(char *)&local_324,
                          (int *)CONCAT17(bVar17,in_stack_fffffffffffffc98),args_1);
      VVar15 = CORRUPTED_BLOCK_DB;
    }
LAB_0036f595:
    ValidationState<BlockValidationResult>::~ValidationState
              (&state.super_ValidationState<BlockValidationResult>);
    CCoinsViewCache::~CCoinsViewCache(&coins);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return VVar15;
}

Assistant:

VerifyDBResult CVerifyDB::VerifyDB(
    Chainstate& chainstate,
    const Consensus::Params& consensus_params,
    CCoinsView& coinsview,
    int nCheckLevel, int nCheckDepth)
{
    AssertLockHeld(cs_main);

    if (chainstate.m_chain.Tip() == nullptr || chainstate.m_chain.Tip()->pprev == nullptr) {
        return VerifyDBResult::SUCCESS;
    }

    // Verify blocks in the best chain
    if (nCheckDepth <= 0 || nCheckDepth > chainstate.m_chain.Height()) {
        nCheckDepth = chainstate.m_chain.Height();
    }
    nCheckLevel = std::max(0, std::min(4, nCheckLevel));
    LogPrintf("Verifying last %i blocks at level %i\n", nCheckDepth, nCheckLevel);
    CCoinsViewCache coins(&coinsview);
    CBlockIndex* pindex;
    CBlockIndex* pindexFailure = nullptr;
    int nGoodTransactions = 0;
    BlockValidationState state;
    int reportDone = 0;
    bool skipped_no_block_data{false};
    bool skipped_l3_checks{false};
    LogPrintf("Verification progress: 0%%\n");

    const bool is_snapshot_cs{chainstate.m_from_snapshot_blockhash};

    for (pindex = chainstate.m_chain.Tip(); pindex && pindex->pprev; pindex = pindex->pprev) {
        const int percentageDone = std::max(1, std::min(99, (int)(((double)(chainstate.m_chain.Height() - pindex->nHeight)) / (double)nCheckDepth * (nCheckLevel >= 4 ? 50 : 100))));
        if (reportDone < percentageDone / 10) {
            // report every 10% step
            LogPrintf("Verification progress: %d%%\n", percentageDone);
            reportDone = percentageDone / 10;
        }
        m_notifications.progress(_("Verifying blocks…"), percentageDone, false);
        if (pindex->nHeight <= chainstate.m_chain.Height() - nCheckDepth) {
            break;
        }
        if ((chainstate.m_blockman.IsPruneMode() || is_snapshot_cs) && !(pindex->nStatus & BLOCK_HAVE_DATA)) {
            // If pruning or running under an assumeutxo snapshot, only go
            // back as far as we have data.
            LogPrintf("VerifyDB(): block verification stopping at height %d (no data). This could be due to pruning or use of an assumeutxo snapshot.\n", pindex->nHeight);
            skipped_no_block_data = true;
            break;
        }
        CBlock block;
        // check level 0: read from disk
        if (!chainstate.m_blockman.ReadBlockFromDisk(block, *pindex)) {
            LogPrintf("Verification error: ReadBlockFromDisk failed at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
            return VerifyDBResult::CORRUPTED_BLOCK_DB;
        }
        // check level 1: verify block validity
        if (nCheckLevel >= 1 && !CheckBlock(block, state, consensus_params)) {
            LogPrintf("Verification error: found bad block at %d, hash=%s (%s)\n",
                      pindex->nHeight, pindex->GetBlockHash().ToString(), state.ToString());
            return VerifyDBResult::CORRUPTED_BLOCK_DB;
        }
        // check level 2: verify undo validity
        if (nCheckLevel >= 2 && pindex) {
            CBlockUndo undo;
            if (!pindex->GetUndoPos().IsNull()) {
                if (!chainstate.m_blockman.UndoReadFromDisk(undo, *pindex)) {
                    LogPrintf("Verification error: found bad undo data at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
                    return VerifyDBResult::CORRUPTED_BLOCK_DB;
                }
            }
        }
        // check level 3: check for inconsistencies during memory-only disconnect of tip blocks
        size_t curr_coins_usage = coins.DynamicMemoryUsage() + chainstate.CoinsTip().DynamicMemoryUsage();

        if (nCheckLevel >= 3) {
            if (curr_coins_usage <= chainstate.m_coinstip_cache_size_bytes) {
                assert(coins.GetBestBlock() == pindex->GetBlockHash());
                DisconnectResult res = chainstate.DisconnectBlock(block, pindex, coins);
                if (res == DISCONNECT_FAILED) {
                    LogPrintf("Verification error: irrecoverable inconsistency in block data at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
                    return VerifyDBResult::CORRUPTED_BLOCK_DB;
                }
                if (res == DISCONNECT_UNCLEAN) {
                    nGoodTransactions = 0;
                    pindexFailure = pindex;
                } else {
                    nGoodTransactions += block.vtx.size();
                }
            } else {
                skipped_l3_checks = true;
            }
        }
        if (chainstate.m_chainman.m_interrupt) return VerifyDBResult::INTERRUPTED;
    }
    if (pindexFailure) {
        LogPrintf("Verification error: coin database inconsistencies found (last %i blocks, %i good transactions before that)\n", chainstate.m_chain.Height() - pindexFailure->nHeight + 1, nGoodTransactions);
        return VerifyDBResult::CORRUPTED_BLOCK_DB;
    }
    if (skipped_l3_checks) {
        LogPrintf("Skipped verification of level >=3 (insufficient database cache size). Consider increasing -dbcache.\n");
    }

    // store block count as we move pindex at check level >= 4
    int block_count = chainstate.m_chain.Height() - pindex->nHeight;

    // check level 4: try reconnecting blocks
    if (nCheckLevel >= 4 && !skipped_l3_checks) {
        while (pindex != chainstate.m_chain.Tip()) {
            const int percentageDone = std::max(1, std::min(99, 100 - (int)(((double)(chainstate.m_chain.Height() - pindex->nHeight)) / (double)nCheckDepth * 50)));
            if (reportDone < percentageDone / 10) {
                // report every 10% step
                LogPrintf("Verification progress: %d%%\n", percentageDone);
                reportDone = percentageDone / 10;
            }
            m_notifications.progress(_("Verifying blocks…"), percentageDone, false);
            pindex = chainstate.m_chain.Next(pindex);
            CBlock block;
            if (!chainstate.m_blockman.ReadBlockFromDisk(block, *pindex)) {
                LogPrintf("Verification error: ReadBlockFromDisk failed at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
                return VerifyDBResult::CORRUPTED_BLOCK_DB;
            }
            if (!chainstate.ConnectBlock(block, state, pindex, coins)) {
                LogPrintf("Verification error: found unconnectable block at %d, hash=%s (%s)\n", pindex->nHeight, pindex->GetBlockHash().ToString(), state.ToString());
                return VerifyDBResult::CORRUPTED_BLOCK_DB;
            }
            if (chainstate.m_chainman.m_interrupt) return VerifyDBResult::INTERRUPTED;
        }
    }

    LogPrintf("Verification: No coin database inconsistencies in last %i blocks (%i transactions)\n", block_count, nGoodTransactions);

    if (skipped_l3_checks) {
        return VerifyDBResult::SKIPPED_L3_CHECKS;
    }
    if (skipped_no_block_data) {
        return VerifyDBResult::SKIPPED_MISSING_BLOCKS;
    }
    return VerifyDBResult::SUCCESS;
}